

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float128 float128_rem_m68k(float128 a,float128 b,float_status *status)

{
  float128 a_00;
  float128 a_01;
  float128 b_00;
  float128 b_01;
  float128 a_02;
  float128 a_03;
  float128 a_04;
  float128 a_05;
  float128 a_06;
  byte bVar1;
  uint64_t uVar2;
  float128 fVar3;
  ulong local_c8;
  uint64_t local_c0;
  uint64_t local_b8;
  int64_t sigMean0;
  uint64_t sigMean1;
  uint64_t alternateASig1;
  uint64_t alternateASig0;
  uint64_t allZero;
  uint64_t term2;
  uint64_t term1;
  uint64_t term0;
  uint64_t q;
  uint64_t bSig1;
  uint64_t bSig0;
  uint64_t aSig1;
  uint64_t aSig0;
  int32_t expDiff;
  int32_t bExp;
  int32_t aExp;
  flag zSign;
  flag aSign;
  float_status *status_local;
  float128 b_local;
  float128 a_local;
  uint64_t local_10;
  
  b_local.low = b.high;
  status_local = (float_status *)b.low;
  local_10 = a.high;
  b_local.high = a.low;
  _aExp = status;
  bSig0 = extractFloat128Frac1(a);
  a_02.high = local_10;
  a_02.low = b_local.high;
  aSig1 = extractFloat128Frac0(a_02);
  a_03.high = local_10;
  a_03.low = b_local.high;
  expDiff = extractFloat128Exp(a_03);
  a_04.high = local_10;
  a_04.low = b_local.high;
  bExp._3_1_ = extractFloat128Sign(a_04);
  fVar3.high = b_local.low;
  fVar3.low = (uint64_t)status_local;
  q = extractFloat128Frac1(fVar3);
  a_00.high = b_local.low;
  a_00.low = (uint64_t)status_local;
  bSig1 = extractFloat128Frac0(a_00);
  a_01.high = b_local.low;
  a_01.low = (uint64_t)status_local;
  aSig0._4_4_ = extractFloat128Exp(a_01);
  if (expDiff == 0x7fff) {
    if ((aSig1 != 0 || bSig0 != 0) || ((aSig0._4_4_ == 0x7fff && (bSig1 != 0 || q != 0)))) {
      a_05.high = local_10;
      a_05.low = b_local.high;
      b_00.high = b_local.low;
      b_00.low = (uint64_t)status_local;
      fVar3 = propagateFloat128NaN(a_05,b_00,_aExp);
      return fVar3;
    }
LAB_0086eaa1:
    float_raise_m68k('\x01',_aExp);
    join_0x00000010_0x00000000_ = float128_default_nan_m68k(_aExp);
  }
  else {
    if (aSig0._4_4_ == 0x7fff) {
      if (bSig1 != 0 || q != 0) {
        a_06.high = local_10;
        a_06.low = b_local.high;
        b_01.high = b_local.low;
        b_01.low = (uint64_t)status_local;
        fVar3 = propagateFloat128NaN(a_06,b_01,_aExp);
        return fVar3;
      }
      a_local.high = b_local.high;
      return stack0xffffffffffffffe8;
    }
    if (aSig0._4_4_ == 0) {
      if (bSig1 == 0 && q == 0) goto LAB_0086eaa1;
      normalizeFloat128Subnormal(bSig1,q,(int32_t *)((long)&aSig0 + 4),&bSig1,&q);
    }
    if (expDiff == 0) {
      if (aSig1 == 0 && bSig0 == 0) {
        a_local.high = b_local.high;
        return stack0xffffffffffffffe8;
      }
      normalizeFloat128Subnormal(aSig1,bSig0,&expDiff,&aSig1,&bSig0);
    }
    aSig0._0_4_ = expDiff - aSig0._4_4_;
    if ((int)aSig0 < -1) {
      a_local.high = b_local.high;
    }
    else {
      shortShift128Left(aSig1 | 0x1000000000000,bSig0,0xf - (uint)((int)aSig0 < 0),&aSig1,&bSig0);
      shortShift128Left(bSig1 | 0x1000000000000,q,0xf,&bSig1,&q);
      bVar1 = le128(bSig1,q,aSig1,bSig0);
      term0 = (uint64_t)bVar1;
      if (term0 != 0) {
        sub128(aSig1,bSig0,bSig1,q,&aSig1,&bSig0);
      }
      for (aSig0._0_4_ = (int)aSig0 + -0x40; 0 < (int)aSig0; aSig0._0_4_ = (int)aSig0 + -0x3d) {
        local_c0 = estimateDiv128To64(aSig1,bSig0,bSig1);
        if (local_c0 < 5) {
          local_c0 = 0;
        }
        else {
          local_c0 = local_c0 - 4;
        }
        term0 = local_c0;
        mul128By64To192(bSig1,q,local_c0,&term1,&term2,&allZero);
        shortShift192Left(term1,term2,allZero,0x3d,&term2,&allZero,&alternateASig0);
        shortShift128Left(aSig1,bSig0,0x3d,&aSig1,&alternateASig0);
        sub128(aSig1,0,term2,allZero,&aSig1,&bSig0);
      }
      if ((int)aSig0 < -0x3f) {
        shift128Right(aSig1,bSig0,0xc,&aSig1,&bSig0);
        shift128Right(bSig1,q,0xc,&bSig1,&q);
      }
      else {
        uVar2 = estimateDiv128To64(aSig1,bSig0,bSig1);
        if (uVar2 < 5) {
          local_c8 = 0;
        }
        else {
          local_c8 = uVar2 - 4;
        }
        term0 = local_c8 >> (-(char)(int)aSig0 & 0x3fU);
        shift128Right(bSig1,q,0xc,&bSig1,&q);
        aSig0._0_4_ = (int)aSig0 + 0x34;
        if ((int)aSig0 < 0) {
          shift128Right(aSig1,bSig0,-(int)aSig0,&aSig1,&bSig0);
        }
        else {
          shortShift128Left(aSig1,bSig0,(int)aSig0,&aSig1,&bSig0);
        }
        mul128By64To192(bSig1,q,term0,&term1,&term2,&allZero);
        sub128(aSig1,bSig0,term2,allZero,&aSig1,&bSig0);
      }
      do {
        alternateASig1 = aSig1;
        sigMean1 = bSig0;
        term0 = term0 + 1;
        sub128(aSig1,bSig0,bSig1,q,&aSig1,&bSig0);
      } while (-1 < (long)aSig1);
      add128(aSig1,bSig0,alternateASig1,sigMean1,&local_b8,(uint64_t *)&sigMean0);
      if (((long)local_b8 < 0) || ((local_b8 == 0 && sigMean0 == 0 && ((term0 & 1) != 0)))) {
        aSig1 = alternateASig1;
        bSig0 = sigMean1;
      }
      bExp._2_1_ = (long)aSig1 < 0;
      if ((bool)bExp._2_1_) {
        sub128(0,0,aSig1,bSig0,&aSig1,&bSig0);
      }
      join_0x00000010_0x00000000_ =
           normalizeRoundAndPackFloat128(bExp._3_1_ ^ bExp._2_1_,aSig0._4_4_ + -4,aSig1,bSig0,_aExp)
      ;
    }
  }
  return stack0xffffffffffffffe8;
}

Assistant:

float128 float128_rem(float128 a, float128 b, float_status *status)
{
    flag aSign, zSign;
    int32_t aExp, bExp, expDiff;
    uint64_t aSig0, aSig1, bSig0, bSig1, q, term0, term1, term2;
    uint64_t allZero, alternateASig0, alternateASig1, sigMean1;
    int64_t sigMean0;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    if ( aExp == 0x7FFF ) {
        if (    ( aSig0 | aSig1 )
             || ( ( bExp == 0x7FFF ) && ( bSig0 | bSig1 ) ) ) {
            return propagateFloat128NaN(a, b, status);
        }
        goto invalid;
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return float128_default_nan(status);
        }
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return a;
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    expDiff = aExp - bExp;
    if ( expDiff < -1 ) return a;
    shortShift128Left(
        aSig0 | UINT64_C(0x0001000000000000),
        aSig1,
        15 - ( expDiff < 0 ),
        &aSig0,
        &aSig1
    );
    shortShift128Left(
        bSig0 | UINT64_C(0x0001000000000000), bSig1, 15, &bSig0, &bSig1 );
    q = le128( bSig0, bSig1, aSig0, aSig1 );
    if ( q ) sub128( aSig0, aSig1, bSig0, bSig1, &aSig0, &aSig1 );
    expDiff -= 64;
    while ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig0 );
        q = ( 4 < q ) ? q - 4 : 0;
        mul128By64To192( bSig0, bSig1, q, &term0, &term1, &term2 );
        shortShift192Left( term0, term1, term2, 61, &term1, &term2, &allZero );
        shortShift128Left( aSig0, aSig1, 61, &aSig0, &allZero );
        sub128( aSig0, 0, term1, term2, &aSig0, &aSig1 );
        expDiff -= 61;
    }
    if ( -64 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig0 );
        q = ( 4 < q ) ? q - 4 : 0;
        q >>= - expDiff;
        shift128Right( bSig0, bSig1, 12, &bSig0, &bSig1 );
        expDiff += 52;
        if ( expDiff < 0 ) {
            shift128Right( aSig0, aSig1, - expDiff, &aSig0, &aSig1 );
        }
        else {
            shortShift128Left( aSig0, aSig1, expDiff, &aSig0, &aSig1 );
        }
        mul128By64To192( bSig0, bSig1, q, &term0, &term1, &term2 );
        sub128( aSig0, aSig1, term1, term2, &aSig0, &aSig1 );
    }
    else {
        shift128Right( aSig0, aSig1, 12, &aSig0, &aSig1 );
        shift128Right( bSig0, bSig1, 12, &bSig0, &bSig1 );
    }
    do {
        alternateASig0 = aSig0;
        alternateASig1 = aSig1;
        ++q;
        sub128( aSig0, aSig1, bSig0, bSig1, &aSig0, &aSig1 );
    } while ( 0 <= (int64_t) aSig0 );
    add128(
        aSig0, aSig1, alternateASig0, alternateASig1, (uint64_t *)&sigMean0, &sigMean1 );
    if (    ( sigMean0 < 0 )
         || ( ( ( sigMean0 | sigMean1 ) == 0 ) && ( q & 1 ) ) ) {
        aSig0 = alternateASig0;
        aSig1 = alternateASig1;
    }
    zSign = ( (int64_t) aSig0 < 0 );
    if ( zSign ) sub128( 0, 0, aSig0, aSig1, &aSig0, &aSig1 );
    return normalizeRoundAndPackFloat128(aSign ^ zSign, bExp - 4, aSig0, aSig1,
                                         status);
}